

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

SetUpTearDownSuiteFuncType
testing::internal::SuiteApiResolver<UnicodeSequenceTest_cpp_u16_Test<char32_t>_>::
GetSetUpCaseOrSuite(char *filename,int line_num)

{
  char cVar1;
  ostream *poVar2;
  GTestLog local_14 [4];
  
  cVar1 = testing::internal::IsTrue(true);
  if (cVar1 == '\0') {
    testing::internal::GTestLog::GTestLog
              (local_14,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/include/gtest/internal/gtest-internal.h"
               ,0x20f);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar2 = std::operator<<(poVar2,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar2 = std::operator<<(poVar2,filename);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,line_num);
    testing::internal::GTestLog::~GTestLog(local_14);
  }
  return (SetUpTearDownSuiteFuncType)0x0;
}

Assistant:

static SetUpTearDownSuiteFuncType GetSetUpCaseOrSuite(const char* filename,
                                                        int line_num) {
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
    SetUpTearDownSuiteFuncType test_case_fp =
        GetNotDefaultOrNull(&T::SetUpTestCase, &Test::SetUpTestCase);
    SetUpTearDownSuiteFuncType test_suite_fp =
        GetNotDefaultOrNull(&T::SetUpTestSuite, &Test::SetUpTestSuite);

    GTEST_CHECK_(!test_case_fp || !test_suite_fp)
        << "Test can not provide both SetUpTestSuite and SetUpTestCase, please "
           "make sure there is only one present at "
        << filename << ":" << line_num;

    return test_case_fp != nullptr ? test_case_fp : test_suite_fp;
#else
    (void)(filename);
    (void)(line_num);
    return &T::SetUpTestSuite;
#endif
  }